

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::SetTxOutData(Psbt *this,uint32_t index,KeyData *key)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  CfdException *this_00;
  undefined4 in_register_00000034;
  KeyData *item;
  pointer this_01;
  Script wpkh_script;
  Pubkey pubkey;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> arr;
  Script redeem_script;
  Script locking_script;
  Script script;
  Script local_68;
  
  (*this->_vptr_Psbt[3])(this,CONCAT44(in_register_00000034,index),0xb61,"SetTxOutData");
  pvVar1 = this->wally_psbt_pointer_;
  GetTxOutKeyDataList(&arr,this,index);
  KeyData::GetPubkey(&pubkey,key);
  this_01 = arr.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (this_01 ==
        arr.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar2 = *(long *)(*(long *)((long)pvVar1 + 8) + 0x20);
      ByteData::ByteData((ByteData *)&redeem_script,*(uint8_t **)(lVar2 + 8 + (ulong)index * 0x70),
                         *(uint32_t *)(lVar2 + 0x10 + (ulong)index * 0x70));
      Script::Script(&locking_script,(ByteData *)&redeem_script);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&redeem_script);
      Script::Script(&redeem_script);
      Script::Script(&script);
      bVar3 = Script::IsP2pkhScript(&locking_script);
      if (bVar3) {
        ScriptUtil::CreateP2pkhLockingScript(&wpkh_script,&pubkey);
        Script::operator=(&script,&wpkh_script);
LAB_003926c3:
        Script::~Script(&wpkh_script);
      }
      else {
        bVar3 = Script::IsP2wpkhScript(&locking_script);
        if (bVar3) {
          ScriptUtil::CreateP2wpkhLockingScript(&wpkh_script,&pubkey);
          Script::operator=(&script,&wpkh_script);
          goto LAB_003926c3;
        }
        bVar3 = Script::IsP2shScript(&locking_script);
        if (bVar3) {
          ScriptUtil::CreateP2wpkhLockingScript(&wpkh_script,&pubkey);
          ScriptUtil::CreateP2shLockingScript(&local_68,&wpkh_script);
          Script::operator=(&script,&local_68);
          Script::~Script(&local_68);
          Script::operator=(&redeem_script,&wpkh_script);
          goto LAB_003926c3;
        }
      }
      bVar3 = Script::Equals(&locking_script,&script);
      if (!bVar3) {
        wpkh_script._vptr_Script = (_func_int **)0x4b240b;
        wpkh_script.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0xb7b;
        wpkh_script.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetTxOutData";
        logger::warn<>((CfdSourceLocation *)&wpkh_script,"unmatch pubkey.");
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&wpkh_script,"psbt unmatch pubkey error.",(allocator *)&local_68);
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&wpkh_script);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
      GetTxOutScript(&wpkh_script,this,index,true,(bool *)0x0);
      bVar3 = Script::IsEmpty(&wpkh_script);
      Script::~Script(&wpkh_script);
      if (!bVar3) {
        Script::Script(&wpkh_script);
        Script::operator=(&redeem_script,&wpkh_script);
        Script::~Script(&wpkh_script);
      }
      SetTxOutData(this,index,&redeem_script,key);
      Script::~Script(&script);
      Script::~Script(&redeem_script);
      Script::~Script(&locking_script);
      break;
    }
    KeyData::GetPubkey((Pubkey *)&locking_script,this_01);
    bVar3 = Pubkey::Equals(&pubkey,(Pubkey *)&locking_script);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&locking_script);
    this_01 = this_01 + 1;
  } while (!bVar3);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&arr);
  return;
}

Assistant:

void Psbt::SetTxOutData(uint32_t index, const KeyData &key) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  std::vector<KeyData> arr = GetTxOutKeyDataList(index);
  Pubkey pubkey = key.GetPubkey();
  for (auto &item : arr) {
    if (pubkey.Equals(item.GetPubkey())) return;
  }

  struct wally_tx_output *txout = &psbt_pointer->tx->outputs[index];
  Script locking_script(
      ByteData(txout->script, static_cast<uint32_t>(txout->script_len)));
  Script redeem_script;
  Script script;

  if (locking_script.IsP2pkhScript()) {
    script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  } else if (locking_script.IsP2wpkhScript()) {
    script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
  } else if (locking_script.IsP2shScript()) {
    auto wpkh_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
    script = ScriptUtil::CreateP2shLockingScript(wpkh_script);
    redeem_script = wpkh_script;
  }
  if (!locking_script.Equals(script)) {
    warn(CFD_LOG_SOURCE, "unmatch pubkey.");
    throw CfdException(kCfdIllegalArgumentError, "psbt unmatch pubkey error.");
  }

  if (!GetTxOutScript(index, true).IsEmpty()) redeem_script = Script();
  SetTxOutData(index, redeem_script, key);
}